

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

void Prs_CreateSignalOut(Cba_Ntk_t *p,int iFon,Prs_Ntk_t *pNtk,int Sig)

{
  Cba_Man_t *pCVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int *piVar4;
  Hash_IntMan_t *p_00;
  Vec_Int_t *pVVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  int *piVar12;
  int Fill;
  int Fill_00;
  int Fill_01;
  Prs_Ntk_t *pNtk_00;
  Prs_Ntk_t *pNtk_01;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  
  if (Sig < 0) {
LAB_003430f0:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x11b,"int Abc_Lit2Att2(int)");
  }
  if (Sig != 0) {
    uVar16 = Sig & 3;
    uVar15 = (uint)Sig >> 2;
    if (uVar16 != 0) {
      uVar6 = Cba_NtkNewStrId(p,"_occ%d_",(ulong)(uint)iFon);
      Cba_FonSetName(p,iFon,uVar6);
      pCVar1 = p->pDesign;
      Vec_IntFillExtra(&pCVar1->vNameMap,uVar6 + 1,Fill);
      if (((int)uVar6 < 0) || ((pCVar1->vNameMap).nSize <= (int)uVar6)) goto LAB_003430d1;
      if ((pCVar1->vNameMap).pArray[uVar6] != 0) {
        __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x37b,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
      }
      Vec_IntFillExtra(&pCVar1->vNameMap,uVar6 + 1,Fill_00);
      if ((int)uVar6 < (pCVar1->vNameMap).nSize) {
        (pCVar1->vNameMap).pArray[uVar6] = iFon;
        Vec_IntPush(&pCVar1->vUsed,uVar6);
        if (uVar16 == 3) {
          uVar16 = (pNtk->vConcats).nSize;
          if ((int)uVar16 <= (int)uVar15) goto LAB_003430d1;
          piVar12 = (pNtk->vConcats).pArray;
          uVar6 = piVar12[uVar15];
          Prs_CatSignals_V_1 = uVar6;
          if (uVar16 <= uVar15 + 1) goto LAB_0034310f;
          piVar12 = piVar12 + (uVar15 + 1);
          Prs_CatSignals_V_2 = piVar12;
          if (1 < (int)uVar6) {
            iVar17 = -1;
            lVar14 = 0;
            do {
              iVar8 = piVar12[lVar14];
              piVar12[lVar14] = piVar12[(int)(uVar6 + iVar17)];
              piVar12[(int)(uVar6 + iVar17)] = iVar8;
              lVar14 = lVar14 + 1;
              iVar17 = iVar17 + -1;
            } while (lVar14 < (int)uVar6 / 2);
          }
          if ((int)uVar6 < 1) {
            iVar17 = 0;
          }
          else {
            pVVar2 = &p->vArray0;
            lVar14 = 0;
            iVar17 = 0;
            do {
              uVar15 = Prs_CatSignals_V_2[lVar14];
              if ((int)uVar15 < 0) goto LAB_003430f0;
              uVar16 = uVar15 >> 2;
              if ((uVar15 & 3) == 1) {
                uVar15 = (pNtk->vSlices).nSize;
                if (((int)uVar15 <= (int)uVar16) || (uVar15 <= uVar16 + 1)) goto LAB_003430d1;
                piVar12 = (pNtk->vSlices).pArray;
                iVar8 = piVar12[uVar16];
                iVar7 = piVar12[uVar16 + 1];
                p_00 = p->pDesign->vHash;
                if (iVar7 == 0) {
                  iVar9 = 0;
                }
                else {
                  if (iVar7 < 0) goto LAB_0034310f;
                  pVVar5 = p_00->vObjs;
                  uVar15 = iVar7 * 4;
                  uVar16 = pVVar5->nSize;
                  if (uVar16 == uVar15 || SBORROW4(uVar16,uVar15) != (int)(uVar16 + iVar7 * -4) < 0)
                  goto LAB_0034310f;
                  piVar4 = pVVar5->pArray;
                  piVar12 = (int *)(ulong)uVar15;
                  iVar9 = piVar4[(long)piVar12] - piVar4[(long)piVar12 + 1];
                }
                iVar10 = -iVar9;
                if (0 < iVar9) {
                  iVar10 = iVar9;
                }
                iVar9 = iVar10 + 1;
                uVar15 = Hash_Int2ManInsert(p_00,iVar10 + iVar17,iVar17,(int)piVar12);
                piVar12 = (int *)(ulong)uVar15;
                iVar10 = Prs_CreateSlice(p,iFon,pNtk_01,uVar15);
                Vec_IntPush(pVVar2,iVar8);
                Vec_IntPush(pVVar2,iVar7);
                Vec_IntPush(pVVar2,iVar10);
LAB_00342fb2:
                iVar17 = iVar9 + iVar17;
              }
              else {
                if ((uVar15 & 3) != 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                                ,0x622,
                                "void Prs_CreateSignalOut(Cba_Ntk_t *, int, Prs_Ntk_t *, int)");
                }
                pcVar11 = Abc_NamStr(p->pDesign->pStrs,uVar16);
                iVar8 = strncmp(pcVar11,"Open_",5);
                if (iVar8 != 0) {
                  uVar15 = Cba_ObjAlloc(p,CBA_BOX_BUF,1,1);
                  if ((int)uVar15 < 1) {
                    __assert_fail("i>0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                                  ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
                  }
                  if ((int)uVar15 < (p->vObjFon0).nSize) {
                    iVar8 = (p->vObjFon0).pArray[uVar15];
                    uVar6 = uVar15;
                    Cba_FonSetName(p,iVar8,uVar16);
                    iVar9 = Prs_CreateRange(p,iVar8,uVar16);
                    iVar8 = Hash_Int2ManInsert(p->pDesign->vHash,iVar17 + iVar9 + -1,iVar17,uVar6);
                    iVar8 = Prs_CreateSlice(p,iFon,pNtk_00,iVar8);
                    if ((int)uVar15 < (p->vObjFin0).nSize) {
                      iVar7 = (p->vObjFin0).pArray[uVar15];
                      piVar12 = (int *)(long)iVar7;
                      if ((long)piVar12 < 1) {
                        __assert_fail("f>0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                                      ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
                      }
                      if (iVar7 < (p->vFinFon).nSize) {
                        piVar4 = (p->vFinFon).pArray;
                        if (piVar4[(long)piVar12] != 0) {
                          __assert_fail("Cba_ObjFinFon(p, i, k)== 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                                        ,0x16e,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
                        }
                        piVar4[(long)piVar12] = iVar8;
                        goto LAB_00342fb2;
                      }
                    }
                  }
                  goto LAB_003430d1;
                }
                iVar17 = iVar17 + 1;
              }
              piVar4 = Prs_CatSignals_V_2;
              uVar15 = Prs_CatSignals_V_1;
              lVar14 = lVar14 + 1;
              uVar13 = (ulong)(int)Prs_CatSignals_V_1;
            } while (lVar14 < (long)uVar13);
            if (1 < (int)Prs_CatSignals_V_1) {
              piVar12 = (int *)(ulong)Prs_CatSignals_V_1;
              iVar8 = (int)Prs_CatSignals_V_1 / 2;
              iVar7 = -1;
              lVar14 = 0;
              do {
                iVar9 = piVar4[lVar14];
                piVar4[lVar14] = piVar4[(int)uVar13 + iVar7];
                piVar4[(int)(uVar15 + iVar7)] = iVar9;
                lVar14 = lVar14 + 1;
                iVar7 = iVar7 + -1;
                uVar13 = (ulong)uVar15;
              } while (lVar14 < iVar8);
            }
          }
        }
        else {
          if (uVar16 != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                          ,0x628,"void Prs_CreateSignalOut(Cba_Ntk_t *, int, Prs_Ntk_t *, int)");
          }
          uVar16 = (pNtk->vSlices).nSize;
          if (((int)uVar16 <= (int)uVar15) || (uVar16 <= uVar15 + 1)) {
LAB_003430d1:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar12 = (pNtk->vSlices).pArray;
          piVar4 = piVar12 + uVar15;
          iVar8 = piVar12[uVar15 + 1];
          if (iVar8 == 0) {
            iVar7 = 0;
          }
          else {
            if (iVar8 < 0) {
LAB_0034310f:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            pVVar2 = p->pDesign->vHash->vObjs;
            uVar15 = iVar8 * 4;
            uVar16 = pVVar2->nSize;
            if (uVar16 == uVar15 || SBORROW4(uVar16,uVar15) != (int)(uVar16 + iVar8 * -4) < 0)
            goto LAB_0034310f;
            piVar3 = pVVar2->pArray;
            piVar12 = (int *)(ulong)uVar15;
            iVar7 = piVar3[(long)piVar12] - piVar3[(long)piVar12 + 1];
          }
          iVar17 = -iVar7;
          if (0 < iVar7) {
            iVar17 = iVar7;
          }
          iVar17 = iVar17 + 1;
          pVVar2 = &p->vArray0;
          Vec_IntPush(pVVar2,*piVar4);
          Vec_IntPush(pVVar2,iVar8);
          Vec_IntPush(pVVar2,iFon);
        }
        iVar17 = Hash_Int2ManInsert(p->pDesign->vHash,iVar17 + -1,0,(int)piVar12);
        if ((p->vFonRange).nSize < 1) {
          __assert_fail("Cba_NtkHasFonRanges(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x186,"void Cba_FonSetRange(Cba_Ntk_t *, int, int)");
        }
        if (iVar17 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10b,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntFillExtra(&p->vFonRange,iFon + 1,Fill_01);
        if ((-1 < iFon) && (iFon < (p->vFonRange).nSize)) {
          (p->vFonRange).pArray[(uint)iFon] = iVar17 * 2;
          return;
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    pcVar11 = Abc_NamStr(p->pDesign->pStrs,uVar15);
    iVar17 = strncmp(pcVar11,"Open_",5);
    if (iVar17 != 0) {
      Cba_FonSetName(p,iFon,uVar15);
      Prs_CreateRange(p,iFon,uVar15);
      return;
    }
  }
  return;
}

Assistant:

void Prs_CreateSignalOut( Cba_Ntk_t * p, int iFon, Prs_Ntk_t * pNtk, int Sig )
{
    int i, iFonNew, NameOut, RangeOut, NameId, RangeId, RangeSize, nBits = 0; 
    Prs_ManType_t SigType = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    int SigValue = Abc_Lit2Var2( Sig );
    if ( !Sig ) return;
    if ( SigType == CBA_PRS_NAME )
    {
        NameId = SigValue;
        if ( !strncmp(Cba_NtkStr(p, NameId), "Open_", 5) )
            return;
        Cba_FonSetName( p, iFon, NameId );
        Prs_CreateRange( p, iFon, NameId );
        return;
    }
    // create name for this fan
    NameOut = Cba_NtkNewStrId( p, "_occ%d_", iFon );
    Cba_FonSetName( p, iFon, NameOut );
    Cba_NtkSetMap( p, NameOut, iFon );
    // consider special cases
    if ( SigType == CBA_PRS_SLICE )
    {
        NameId  = Prs_SliceName(pNtk, SigValue);
        RangeId = Prs_SliceRange(pNtk, SigValue);
        nBits   = Cba_NtkRangeSize(p, RangeId);
        // save this slice
        Vec_IntPushThree( &p->vArray0, NameId, RangeId, iFon );
    }
    else if ( SigType == CBA_PRS_CONCAT )
    {
        Vec_Int_t * vSigs = Prs_CatSignals(pNtk, SigValue);
        Vec_IntReverseOrder( vSigs );
        Vec_IntForEachEntry( vSigs, Sig, i )
        {
            SigType = (Prs_ManType_t)Abc_Lit2Att2( Sig );
            SigValue = Abc_Lit2Var2( Sig );
            if ( SigType == CBA_PRS_NAME )
            {
                int iObjBuf, iFonBuf;
                // create buffer
                NameId = SigValue;
                if ( !strncmp(Cba_NtkStr(p, NameId), "Open_", 5) )
                {
                    nBits++;
                    continue;
                }
                iObjBuf   = Cba_ObjAlloc( p, CBA_BOX_BUF, 1, 1 );
                iFonBuf   = Cba_ObjFon0(p, iObjBuf);
                Cba_FonSetName( p, iFonBuf, NameId );
                RangeSize = Prs_CreateRange( p, iFonBuf, NameId );
                RangeOut  = Cba_NtkHashRange(p, nBits+RangeSize-1, nBits);
                // create slice
                iFonNew   = Prs_CreateSlice( p, iFon, pNtk, RangeOut );
                Cba_ObjSetFinFon( p, iObjBuf, 0, iFonNew );
            }
            else if ( SigType == CBA_PRS_SLICE )
            {
                NameId    = Prs_SliceName(pNtk, SigValue);
                RangeId   = Prs_SliceRange(pNtk, SigValue);
                RangeSize = Cba_NtkRangeSize(p, RangeId);
                RangeOut  = Cba_NtkHashRange(p, nBits+RangeSize-1, nBits);
                // create slice
                iFonNew   = Prs_CreateSlice( p, iFon, pNtk, RangeOut );
                // save this slice
                Vec_IntPushThree( &p->vArray0, NameId, RangeId, iFonNew );
            }
            else assert( 0 );
            // increment complete range
            nBits += RangeSize;
        }
        Vec_IntReverseOrder( vSigs );
    }
    else assert( 0 );
    // set the range for the output
    Cba_FonHashRange( p, iFon, nBits-1, 0 );
}